

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcolumn_bmod.c
# Opt level: O1

int dcolumn_bmod(int jcol,int nseg,double *dense,double *tempv,int *segrep,int *repfnz,int fpanelc,
                GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  long lVar1;
  int iVar2;
  int_t *piVar3;
  uint uVar4;
  int_t iVar5;
  uint ldm;
  int_t next;
  ulong uVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int_t *piVar19;
  uint nrow;
  int iVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  void *local_d0;
  int_t local_c4;
  double *local_c0;
  int_t *local_b8;
  int_t *local_b0;
  ulong local_a8;
  int local_9c;
  uint local_98;
  uint local_94;
  int_t *local_90;
  ulong local_88;
  double *local_80;
  long local_78;
  long local_70;
  flops_t *local_68;
  int *local_60;
  long local_58;
  long local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_68 = stat->ops;
  local_60 = Glu->xsup;
  local_40 = Glu->supno;
  local_b8 = Glu->lsub;
  local_90 = Glu->xlsub;
  local_d0 = Glu->lusup;
  piVar19 = Glu->xlusup;
  local_c4 = Glu->nzlumax;
  local_70 = (long)jcol;
  local_58 = (long)local_40[local_70];
  local_c0 = tempv;
  local_b0 = piVar19;
  local_9c = jcol;
  local_94 = nseg;
  local_48 = repfnz;
  local_38 = segrep;
  if (0 < nseg) {
    uVar6 = (ulong)(uint)nseg;
    local_78 = (long)local_d0 + 8;
    uVar10 = 0;
    do {
      piVar3 = local_b8;
      iVar13 = local_38[uVar6 - 1];
      local_88 = uVar10;
      local_80 = (double *)uVar6;
      if ((int)local_58 != local_40[iVar13]) {
        iVar11 = local_60[local_40[iVar13]];
        iVar15 = fpanelc;
        if (fpanelc < iVar11) {
          iVar15 = iVar11;
        }
        iVar18 = iVar15 - iVar11;
        iVar20 = piVar19[iVar15] + iVar18;
        iVar12 = local_90[iVar11] + iVar18;
        iVar14 = local_48[iVar13];
        if (local_48[iVar13] <= fpanelc) {
          iVar14 = fpanelc;
        }
        uVar4 = (iVar13 - iVar14) + 1;
        uVar16 = iVar13 - iVar15;
        iVar2 = local_90[(long)iVar11 + 1];
        lVar8 = (long)iVar2;
        ldm = iVar2 - local_90[iVar11];
        local_a8 = (ulong)ldm;
        nrow = (~uVar16 - iVar18) + ldm;
        iVar18 = uVar16 + iVar12;
        local_68[0x13] = (float)(int)((iVar13 - iVar14) * uVar4) + local_68[0x13];
        iVar11 = uVar16 + iVar12 + 1;
        local_68[0x14] = (float)(int)(nrow * uVar4 * 2) + local_68[0x14];
        piVar19 = local_b0;
        local_98 = uVar4;
        if (iVar13 == iVar14) {
          if (iVar11 < iVar2) {
            dVar23 = dense[local_b8[iVar18]];
            lVar7 = (long)iVar11;
            pdVar9 = (double *)
                     ((long)local_d0 + (long)(int)(ldm * uVar16 + iVar20 + uVar16 + 1) * 8);
            do {
              dense[local_b8[lVar7]] = *pdVar9 * -dVar23 + dense[local_b8[lVar7]];
              lVar7 = lVar7 + 1;
              pdVar9 = pdVar9 + 1;
            } while (lVar7 < lVar8);
          }
        }
        else if (iVar13 - iVar14 < 3) {
          iVar13 = local_b8[iVar18];
          iVar20 = (ldm + 1) * uVar16 + iVar20;
          iVar15 = local_b8[(long)iVar18 + -1];
          dVar23 = dense[iVar15];
          lVar7 = (long)(int)(iVar20 - ldm);
          if (uVar4 == 2) {
            dVar21 = dense[iVar13] - *(double *)((long)local_d0 + lVar7 * 8) * dVar23;
            dense[iVar13] = dVar21;
            if (iVar11 < iVar2) {
              lVar17 = 0;
              do {
                dense[local_b8[iVar11 + lVar17]] =
                     dense[local_b8[iVar11 + lVar17]] -
                     (*(double *)(local_78 + (long)iVar20 * 8 + lVar17 * 8) * dVar21 +
                     *(double *)(local_78 + lVar7 * 8 + lVar17 * 8) * dVar23);
                lVar1 = iVar11 + lVar17;
                lVar17 = lVar17 + 1;
              } while (lVar1 + 1 < lVar8);
            }
          }
          else {
            dVar21 = dense[local_b8[(long)iVar18 + -2]];
            lVar17 = (long)(int)((iVar20 - ldm) - ldm);
            dVar23 = dVar23 - *(double *)((long)local_d0 + lVar17 * 8 + -8) * dVar21;
            dVar22 = (dense[iVar13] - *(double *)((long)local_d0 + lVar7 * 8) * dVar23) -
                     *(double *)((long)local_d0 + lVar17 * 8) * dVar21;
            dense[iVar13] = dVar22;
            dense[iVar15] = dVar23;
            if (iVar11 < iVar2) {
              lVar17 = 0;
              do {
                dense[local_b8[iVar11 + lVar17]] =
                     dense[local_b8[iVar11 + lVar17]] -
                     (*(double *)(lVar7 * 8 + (long)(int)ldm * -8 + local_78 + lVar17 * 8) * dVar21
                     + *(double *)(local_78 + (long)iVar20 * 8 + lVar17 * 8) * dVar22 +
                       *(double *)(local_78 + lVar7 * 8 + lVar17 * 8) * dVar23);
                lVar1 = iVar11 + lVar17;
                lVar17 = lVar17 + 1;
              } while (lVar1 + 1 < lVar8);
            }
          }
        }
        else {
          iVar12 = iVar12 + (iVar14 - iVar15);
          uVar6 = (ulong)((iVar13 - iVar14) + 1);
          uVar10 = 0;
          do {
            local_c0[uVar10] = dense[local_b8[(long)iVar12 + uVar10]];
            uVar10 = uVar10 + 1;
          } while (uVar6 != uVar10);
          local_50 = (long)(int)((ldm + 1) * (iVar14 - iVar15) + iVar20);
          dlsolve(ldm,uVar4,(double *)((long)local_d0 + local_50 * 8),local_c0);
          pdVar9 = local_c0 + uVar4;
          dmatvec((int)local_a8,nrow,uVar4,
                  (double *)((long)local_d0 + (long)(int)((int)local_50 + uVar4) * 8),local_c0,
                  pdVar9);
          uVar10 = 0;
          iVar13 = iVar12;
          do {
            dense[piVar3[(long)iVar12 + uVar10]] = local_c0[uVar10];
            local_c0[uVar10] = 0.0;
            uVar10 = uVar10 + 1;
            iVar13 = iVar13 + 1;
          } while (uVar6 != uVar10);
          piVar19 = local_b0;
          if (0 < (int)nrow) {
            uVar10 = 0;
            do {
              dense[local_b8[(long)iVar13 + uVar10]] =
                   dense[local_b8[(long)iVar13 + uVar10]] - pdVar9[uVar10];
              pdVar9[uVar10] = 0.0;
              uVar10 = uVar10 + 1;
            } while (uVar10 < nrow);
          }
        }
      }
      uVar6 = (long)local_80 - 1;
      uVar4 = (int)local_88 + 1;
      uVar10 = (ulong)uVar4;
    } while (uVar4 != local_94);
  }
  next = piVar19[local_70];
  iVar13 = local_60[local_58];
  iVar11 = (local_90[(long)iVar13 + 1] + next) - local_90[iVar13];
  if (local_c4 < iVar11) {
    do {
      iVar5 = dLUMemXpand(local_9c,next,LUSUP,&local_c4,Glu);
      if (iVar5 != 0) {
        return iVar5;
      }
    } while (local_c4 < iVar11);
    local_b8 = Glu->lsub;
    local_d0 = Glu->lusup;
    piVar19 = local_b0;
  }
  iVar11 = local_90[iVar13];
  iVar15 = local_90[(long)iVar13 + 1];
  if (iVar11 < iVar15) {
    lVar8 = 0;
    do {
      iVar12 = local_b8[iVar11 + lVar8];
      *(double *)((long)local_d0 + lVar8 * 8 + (long)next * 8) = dense[iVar12];
      dense[iVar12] = 0.0;
      lVar8 = lVar8 + 1;
    } while ((long)iVar15 - (long)iVar11 != lVar8);
    next = (int)lVar8 + next;
  }
  if (fpanelc < iVar13) {
    fpanelc = iVar13;
  }
  piVar19[local_70 + 1] = next;
  iVar11 = local_9c - fpanelc;
  if (iVar11 != 0 && fpanelc <= local_9c) {
    iVar15 = piVar19[fpanelc];
    iVar14 = local_90[(long)iVar13 + 1] - local_90[iVar13];
    uVar4 = (iVar13 - local_9c) + iVar14;
    iVar12 = piVar19[local_70];
    local_68[0x13] = (float)((iVar11 + -1) * iVar11) + local_68[0x13];
    local_88 = (long)iVar15 + (long)(fpanelc - iVar13);
    lVar8 = (long)iVar12 + (long)(fpanelc - iVar13);
    local_68[0x14] = (float)(int)(iVar11 * uVar4 * 2) + local_68[0x14];
    local_80 = (double *)((long)local_d0 + lVar8 * 8);
    dlsolve(iVar14,iVar11,(double *)((long)local_d0 + local_88 * 8),local_80);
    dmatvec(iVar14,uVar4,iVar11,(double *)((long)local_d0 + (long)((int)local_88 + iVar11) * 8),
            local_80,local_c0);
    if (0 < (int)uVar4) {
      iVar11 = (int)lVar8 + iVar11;
      uVar10 = 0;
      do {
        *(double *)((long)local_d0 + uVar10 * 8 + (long)iVar11 * 8) =
             *(double *)((long)local_d0 + uVar10 * 8 + (long)iVar11 * 8) - local_c0[uVar10];
        local_c0[uVar10] = 0.0;
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar4);
    }
  }
  return 0;
}

Assistant:

int
dcolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     double     *dense,	  /* in */
	     double     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    double      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    double      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    double       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    double       *tempv1;
    double      zero = 0.0;
    double      one = 1.0;
    double      none = -1.0;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (double *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;

	    ops[TRSV] += segsze * (segsze - 1);
	    ops[GEMV] += 2 * nrow * segsze;


	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    dense[irow] -=  ukj*lusup[luptr];
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    ukj -= ukj1 * lusup[luptr1];
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
		    	dense[irow] -= ( ukj*lusup[luptr]
					+ ukj1*lusup[luptr1] );
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
		    ukj1 -= ukj2 * lusup[luptr2-1];
		    ukj = ukj - ukj1*lusup[luptr1] - ukj2*lusup[luptr2];
		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
		    	dense[irow] -= ( ukj*lusup[luptr]
			     + ukj1*lusup[luptr1] + ukj2*lusup[luptr2] );
		    }
		}



	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		STRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		dtrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		SGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		dgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		dlsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		dmatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    dense[irow] -= tempv1[i];
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = dLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (double *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += nsupc * (nsupc - 1);
	ops[GEMV] += 2 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	dtrsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	SGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	dgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	dlsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	dmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    lusup[isub] -= tempv[i];
	    tempv[i] = 0.0;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}